

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void ring_bell(tgestate_t *state)

{
  char cVar1;
  tgestate_t *state_00;
  long in_RDI;
  bellring_t bell;
  bellring_t *pbell;
  undefined4 in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  sound_t sound;
  
  state_00 = (tgestate_t *)(in_RDI + 0x6e8);
  cVar1 = (char)state_00->width;
  if (cVar1 != -1) {
    if ((cVar1 == '\0') || (*(char *)&state_00->width = cVar1 + -1, (char)(cVar1 + -1) != '\0')) {
      cVar1 = *(char *)(*(long *)(in_RDI + 0x18) + 0x11be);
      sound = CONCAT13(cVar1,in_stack_ffffffffffffffec);
      if (cVar1 == '?') {
        plot_ringer(state_00,(uint8_t *)CONCAT44(sound,in_stack_ffffffffffffffe8));
      }
      else {
        plot_ringer(state_00,(uint8_t *)CONCAT44(sound,in_stack_ffffffffffffffe8));
        play_speaker(state_00,sound);
      }
    }
    else {
      *(undefined1 *)&state_00->width = 0xff;
    }
  }
  return;
}

Assistant:

void ring_bell(tgestate_t *state)
{
  /**
   * $A147: Bell ringer bitmaps.
   */
  static const uint8_t bell_ringer_bitmap_off[] =
  {
    0xE7, 0xE7, 0x83, 0x83, 0x43, 0x41, 0x20, 0x10, 0x08, 0x04, 0x02, 0x02
  };
  static const uint8_t bell_ringer_bitmap_on[] =
  {
    0x3F, 0x3F, 0x27, 0x13, 0x13, 0x09, 0x08, 0x04, 0x04, 0x02, 0x02, 0x01
  };

  bellring_t *pbell; /* was HL */
  bellring_t  bell;  /* was A */

  assert(state != NULL);

  pbell = &state->bell;
  bell = *pbell;
  if (bell == bell_STOP)
    return; /* Not ringing */

  if (bell != bell_RING_PERPETUAL)
  {
    /* Decrement the ring counter. */
    *pbell = --bell;
    if (bell == 0)
    {
      /* Counter hit zero - stop ringing. */
      *pbell = bell_STOP;
      return;
    }
  }

  /* Fetch visible state of bell. */
  bell = state->speccy->screen.pixels[screenoffset_BELL_RINGER];
  if (bell != 0x3F) /* Pixel value is 0x3F if on */
  {
    /* Plot ringer "on". */
    plot_ringer(state, bell_ringer_bitmap_on);
    play_speaker(state, sound_BELL_RINGER);
  }
  else
  {
    /* Plot ringer "off". */
    plot_ringer(state, bell_ringer_bitmap_off);
  }
}